

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

Matrix * __thiscall sptk::Matrix::operator-(Matrix *__return_storage_ptr__,Matrix *this)

{
  Matrix(__return_storage_ptr__,this);
  Negate(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::operator-() const {
  Matrix result(*this);
  result.Negate();
  return result;
}